

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> * __thiscall
pybind11::class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var>::
def_property<kratos::PortDirection(kratos::Port::*)()const>
          (class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var> *this,char *name,
          offset_in_Var_to_subr *fget,cpp_function *fset)

{
  class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *pcVar1;
  is_method local_40;
  cpp_function local_38;
  return_value_policy local_29;
  
  cpp_function::cpp_function<kratos::PortDirection,kratos::Port>(&local_38,*fget);
  local_29 = reference_internal;
  local_40.class_.m_ptr = *(handle *)this;
  pcVar1 = def_property_static<pybind11::is_method,pybind11::return_value_policy>
                     (this,name,&local_38,fset,&local_40,&local_29);
  object::~object((object *)&local_38);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }